

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

void print_menu_instructions(void)

{
  Term_clear();
  text_out_hook = text_out_to_screen;
  text_out_indent = L'\x02';
  Term_gotoxy(L'\x02',L'\x01');
  text_out_e(
            "{light blue}Please select your character traits from the menus below:{/}\n\nUse the {light green}movement keys{/} to scroll the menu, {light green}Enter{/} to select the current menu item, \'{light green}*{/}\' for a random menu item, \'{light green}@{/}\' to finish the character with random selections, \'{light green}ESC{/}\' to step back through the birth process, \'{light green}={/}\' for the birth options, \'{light green}?{/}\' for help, or \'{light green}Ctrl-X{/}\' to quit."
            );
  text_out_indent = L'\0';
  return;
}

Assistant:

static void print_menu_instructions(void)
{
	/* Clear screen */
	Term_clear();
	
	/* Output to the screen */
	text_out_hook = text_out_to_screen;
	
	/* Indent output */
	text_out_indent = QUESTION_COL;
	Term_gotoxy(QUESTION_COL, HEADER_ROW);
	
	/* Display some helpful information */
	text_out_e(BIRTH_MENU_HELPTEXT);
	
	/* Reset text_out() indentation */
	text_out_indent = 0;
}